

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_parameters_dense.h
# Opt level: O1

void __thiscall
dense_parameters::set_default<random_weights_wrapper<dense_parameters>>(dense_parameters *this)

{
  weight *pwVar1;
  uint32_t uVar2;
  long lVar3;
  float fVar4;
  uint64_t local_30;
  
  pwVar1 = this->_begin;
  if (pwVar1 != pwVar1 + this->_weight_mask + 1) {
    uVar2 = this->_stride_shift;
    lVar3 = 0;
    do {
      local_30 = lVar3 >> 2;
      fVar4 = merand48(&local_30);
      *(float *)((long)pwVar1 + lVar3) = fVar4 + -0.5;
      lVar3 = lVar3 + (1L << ((byte)uVar2 & 0x3f)) * 4;
    } while ((weight *)((long)pwVar1 + lVar3) != this->_begin + this->_weight_mask + 1);
  }
  return;
}

Assistant:

iterator end() { return iterator(_begin + _weight_mask + 1, _begin, stride()); }